

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

void __thiscall
vkt::api::anon_unknown_1::Framebuffer::Resources::Resources
          (Resources *this,Environment *env,Parameters *param_2)

{
  Parameters *pPVar1;
  Resources *extraout_RDX;
  Parameters local_90;
  
  local_90.image.flags = 0;
  local_90.image.imageType = VK_IMAGE_TYPE_2D;
  local_90.image.format = VK_FORMAT_R8G8B8A8_UNORM;
  local_90.image.extent.width = 0x100;
  local_90.image.extent.height = 0x100;
  local_90.image.extent.depth = 1;
  local_90.image.mipLevels = 1;
  local_90.image.arraySize = 1;
  local_90.image.samples = VK_SAMPLE_COUNT_1_BIT;
  local_90.image.tiling = VK_IMAGE_TILING_OPTIMAL;
  local_90.image.usage = 0x10;
  local_90.image.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  local_90.viewType = VK_IMAGE_VIEW_TYPE_2D;
  local_90.format = VK_FORMAT_R8G8B8A8_UNORM;
  local_90.components.r = VK_COMPONENT_SWIZZLE_R;
  local_90.components.g = VK_COMPONENT_SWIZZLE_G;
  local_90.components.b = VK_COMPONENT_SWIZZLE_B;
  local_90.components.a = VK_COMPONENT_SWIZZLE_A;
  local_90.subresourceRange.aspectMask = 1;
  local_90.subresourceRange.baseMipLevel = 0;
  local_90.subresourceRange.levelCount = 1;
  local_90.subresourceRange.baseArrayLayer = 0;
  local_90.subresourceRange.layerCount = 1;
  Dependency<vkt::api::(anonymous_namespace)::ImageView>::Dependency
            (&this->colorAttachment,env,&local_90);
  local_90.image.flags = 0;
  local_90.image.imageType = VK_IMAGE_TYPE_2D;
  local_90.image.format = VK_FORMAT_D16_UNORM;
  pPVar1 = (Parameters *)0x10000000100;
  local_90.image.extent.width = 0x100;
  local_90.image.extent.height = 0x100;
  local_90.image.extent.depth = 1;
  local_90.image.mipLevels = 1;
  local_90.image.arraySize = 1;
  local_90.image.samples = VK_SAMPLE_COUNT_1_BIT;
  local_90.image.tiling = VK_IMAGE_TILING_OPTIMAL;
  local_90.image.usage = 0x20;
  local_90.image.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  local_90.viewType = VK_IMAGE_VIEW_TYPE_2D;
  local_90.format = VK_FORMAT_D16_UNORM;
  local_90.components.r = VK_COMPONENT_SWIZZLE_R;
  local_90.components.g = VK_COMPONENT_SWIZZLE_G;
  local_90.components.b = VK_COMPONENT_SWIZZLE_B;
  local_90.components.a = VK_COMPONENT_SWIZZLE_A;
  local_90.subresourceRange.aspectMask = 2;
  local_90.subresourceRange.baseMipLevel = 0;
  local_90.subresourceRange.levelCount = 1;
  local_90.subresourceRange.baseArrayLayer = 0;
  local_90.subresourceRange.layerCount = 1;
  Dependency<vkt::api::(anonymous_namespace)::ImageView>::Dependency
            (&this->depthStencilAttachment,env,&local_90);
  RenderPass::create((Move<vk::Handle<(vk::HandleType)17>_> *)&local_90,env,extraout_RDX,pPVar1);
  (this->renderPass).object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       (VkDevice)CONCAT44(local_90.image.extent.depth,local_90.image.extent.height);
  (this->renderPass).object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)CONCAT44(local_90.image.arraySize,local_90.image.mipLevels)
  ;
  (this->renderPass).object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal
       = local_90.image._0_8_;
  (this->renderPass).object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)CONCAT44(local_90.image.extent.width,local_90.image.format);
  return;
}

Assistant:

Resources (const Environment& env, const Parameters&)
			: colorAttachment			(env, ImageView::Parameters(Image::Parameters(0u, VK_IMAGE_TYPE_2D, VK_FORMAT_R8G8B8A8_UNORM,
																					  makeExtent3D(256, 256, 1),
																					  1u, 1u,
																					  VK_SAMPLE_COUNT_1_BIT,
																					  VK_IMAGE_TILING_OPTIMAL,
																					  VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT,
																					  VK_IMAGE_LAYOUT_UNDEFINED),
																		 VK_IMAGE_VIEW_TYPE_2D, VK_FORMAT_R8G8B8A8_UNORM,
																		 makeComponentMappingRGBA(),
																		 makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u)))
			, depthStencilAttachment	(env, ImageView::Parameters(Image::Parameters(0u, VK_IMAGE_TYPE_2D, VK_FORMAT_D16_UNORM,
																					  makeExtent3D(256, 256, 1),
																					  1u, 1u,
																					  VK_SAMPLE_COUNT_1_BIT,
																					  VK_IMAGE_TILING_OPTIMAL,
																					  VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT,
																					  VK_IMAGE_LAYOUT_UNDEFINED),
																		 VK_IMAGE_VIEW_TYPE_2D, VK_FORMAT_D16_UNORM,
																		 makeComponentMappingRGBA(),
																		 makeImageSubresourceRange(VK_IMAGE_ASPECT_DEPTH_BIT, 0u, 1u, 0u, 1u)))
			, renderPass				(env, RenderPass::Parameters())
		{}